

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

void __thiscall QWizardPrivate::_q_updateButtonStates(QWizardPrivate *this)

{
  long lVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  QWidget *this_00;
  QAbstractButton *pQVar5;
  byte bVar6;
  undefined1 uVar7;
  byte bVar8;
  QWizardPage *pQVar9;
  QWizardPage *pQVar10;
  QPushButton *pQVar11;
  long lVar12;
  byte bVar13;
  uint uVar14;
  long in_FS_OFFSET;
  bool bVar15;
  QWizardPage *local_40;
  int local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  disableUpdates(this);
  lVar12 = *(long *)(lVar3 + 8);
  local_34 = *(int *)(lVar12 + 0x340);
  local_40 = (QWizardPage *)0x0;
  pQVar9 = QMap<int,_QWizardPage_*>::value
                     ((QMap<int,_QWizardPage_*> *)(lVar12 + 0x2e0),&local_34,&local_40);
  if (pQVar9 == (QWizardPage *)0x0) {
    bVar6 = 0;
  }
  else {
    bVar6 = (**(code **)(*(long *)&pQVar9->super_QWidget + 0x1b8))(pQVar9);
  }
  uVar4 = (this->history).d.size;
  this_00 = &((this->field_20).btn.back)->super_QWidget;
  if (uVar4 < 2) {
LAB_0050a7a4:
    bVar15 = false;
  }
  else {
    local_34 = (this->history).d.ptr[uVar4 - 2];
    local_40 = (QWizardPage *)0x0;
    pQVar10 = QMap<int,_QWizardPage_*>::value
                        ((QMap<int,_QWizardPage_*> *)(*(long *)(lVar3 + 8) + 0x2e0),&local_34,
                         &local_40);
    if (*(char *)(*(long *)&(pQVar10->super_QWidget).field_0x8 + 0x30d) != '\0') goto LAB_0050a7a4;
    bVar15 = true;
    if (this->canFinish == true) {
      bVar15 = ((this->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
                super_QFlagsStorage<QWizard::WizardOption>.i & 0x40) == 0;
    }
  }
  QWidget::setEnabled(this_00,bVar15);
  QWidget::setEnabled(&((this->field_20).btn.next)->super_QWidget,(bool)(this->canContinue & bVar6))
  ;
  QWidget::setEnabled(&((this->field_20).btn.commit)->super_QWidget,
                      (bool)(this->canContinue & bVar6));
  QWidget::setEnabled(&((this->field_20).btn.finish)->super_QWidget,(bool)(bVar6 & this->canFinish))
  ;
  if (this->buttonsHaveCustomLayout == true) {
    lVar3 = (this->buttonsCustomLayout).d.size;
    if (lVar3 != 0) {
      lVar12 = 0;
      do {
        if (lVar3 << 2 == lVar12) goto LAB_0050a85b;
        lVar1 = lVar12 + 4;
        piVar2 = (int *)((long)(this->buttonsCustomLayout).d.ptr + lVar12);
        lVar12 = lVar1;
      } while (*piVar2 != 0);
      if (lVar1 != 0) goto LAB_0050a831;
    }
LAB_0050a85b:
    bVar15 = false;
  }
  else {
LAB_0050a831:
    if (((ulong)(this->history).d.size < 2) &&
       (((this->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
         super_QFlagsStorage<QWizard::WizardOption>.i & 0x10) != 0)) goto LAB_0050a85b;
    bVar15 = true;
    if (this->canContinue == false) {
      bVar15 = ((this->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
                super_QFlagsStorage<QWizard::WizardOption>.i & 0x20) == 0;
    }
  }
  if (pQVar9 == (QWizardPage *)0x0) {
    bVar6 = 0;
  }
  else {
    bVar6 = *(byte *)(*(long *)&(pQVar9->super_QWidget).field_0x8 + 0x30d);
  }
  pQVar5 = (this->field_20).btn.back;
  (**(code **)(*(long *)&pQVar5->super_QWidget + 0x68))(pQVar5,bVar15);
  pQVar5 = (this->field_20).btn.next;
  if (this->buttonsHaveCustomLayout == true) {
    lVar3 = (this->buttonsCustomLayout).d.size;
    if (lVar3 != 0) {
      lVar12 = 0;
      do {
        if (lVar3 << 2 == lVar12) goto LAB_0050a8cf;
        lVar1 = lVar12 + 4;
        piVar2 = (int *)((long)(this->buttonsCustomLayout).d.ptr + lVar12);
        lVar12 = lVar1;
      } while (*piVar2 != 1);
      bVar15 = lVar1 == 0;
      goto LAB_0050a8c6;
    }
LAB_0050a8cf:
    bVar13 = 0;
  }
  else {
    bVar15 = false;
LAB_0050a8c6:
    if (bVar15 || bVar6 != 0) goto LAB_0050a8cf;
    bVar13 = 1;
    if (this->canContinue == false) {
      bVar13 = (byte)(this->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
                     super_QFlagsStorage<QWizard::WizardOption>.i >> 7;
    }
  }
  (**(code **)(*(long *)&pQVar5->super_QWidget + 0x68))(pQVar5,bVar13);
  pQVar5 = (this->field_20).btn.commit;
  if (this->buttonsHaveCustomLayout == true) {
    lVar3 = (this->buttonsCustomLayout).d.size;
    if (lVar3 != 0) {
      lVar12 = 0;
      do {
        if (lVar3 << 2 == lVar12) goto LAB_0050a93c;
        lVar1 = lVar12 + 4;
        piVar2 = (int *)((long)(this->buttonsCustomLayout).d.ptr + lVar12);
        lVar12 = lVar1;
      } while (*piVar2 != 2);
      bVar15 = lVar1 == 0;
      goto LAB_0050a91f;
    }
LAB_0050a93c:
    bVar13 = bVar6 ^ 1;
    uVar7 = 0;
  }
  else {
    bVar15 = false;
LAB_0050a91f:
    bVar13 = bVar6 ^ 1;
    uVar7 = 0;
    if ((!bVar15) && (uVar7 = 0, bVar13 == 0)) {
      uVar7 = this->canContinue;
      bVar13 = 0;
    }
  }
  (**(code **)(*(long *)&pQVar5->super_QWidget + 0x68))(pQVar5,uVar7);
  pQVar5 = (this->field_20).btn.finish;
  if (this->buttonsHaveCustomLayout == true) {
    lVar3 = (this->buttonsCustomLayout).d.size;
    if (lVar3 != 0) {
      lVar12 = 0;
      do {
        if (lVar3 << 2 == lVar12) goto LAB_0050a9a3;
        lVar1 = lVar12 + 4;
        piVar2 = (int *)((long)(this->buttonsCustomLayout).d.ptr + lVar12);
        lVar12 = lVar1;
      } while (*piVar2 != 3);
      if (lVar1 != 0) goto LAB_0050a98e;
    }
LAB_0050a9a3:
    bVar8 = 0;
  }
  else {
LAB_0050a98e:
    bVar8 = 1;
    if (this->canFinish == false) {
      bVar8 = *(byte *)((long)&(this->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
                               super_QFlagsStorage<QWizard::WizardOption>.i + 1) & 1;
    }
  }
  (**(code **)(*(long *)&pQVar5->super_QWidget + 0x68))(pQVar5,bVar8);
  uVar14 = (this->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
           super_QFlagsStorage<QWizard::WizardOption>.i;
  if ((uVar14 >> 9 & 1) != 0) goto LAB_0050aa62;
  pQVar5 = (this->field_20).btn.cancel;
  if (this->buttonsHaveCustomLayout == true) {
    lVar3 = (this->buttonsCustomLayout).d.size;
    if (lVar3 != 0) {
      lVar12 = 0;
      do {
        if (lVar3 << 2 == lVar12) goto LAB_0050aa50;
        lVar1 = lVar12 + 4;
        piVar2 = (int *)((long)(this->buttonsCustomLayout).d.ptr + lVar12);
        lVar12 = lVar1;
      } while (*piVar2 != 4);
      if (lVar1 != 0) goto LAB_0050aa00;
    }
LAB_0050aa50:
    bVar15 = false;
  }
  else {
LAB_0050aa00:
    bVar15 = true;
    if (this->canContinue == false) {
      bVar15 = (uVar14 >> 0x10 & 1) == 0;
    }
  }
  (**(code **)(*(long *)&pQVar5->super_QWidget + 0x68))(pQVar5,bVar15);
  uVar14 = (this->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
           super_QFlagsStorage<QWizard::WizardOption>.i;
LAB_0050aa62:
  pQVar11 = (QPushButton *)QMetaObject::cast((QObject *)&QPushButton::staticMetaObject);
  if (pQVar11 != (QPushButton *)0x0) {
    QPushButton::setDefault(pQVar11,(bool)((uVar14 & 8) == 0 & this->canContinue & bVar13));
  }
  pQVar11 = (QPushButton *)QMetaObject::cast((QObject *)&QPushButton::staticMetaObject);
  if (pQVar11 != (QPushButton *)0x0) {
    QPushButton::setDefault(pQVar11,(bool)((uVar14 & 8) == 0 & this->canContinue & bVar6));
  }
  pQVar11 = (QPushButton *)QMetaObject::cast((QObject *)&QPushButton::staticMetaObject);
  if (pQVar11 != (QPushButton *)0x0) {
    QPushButton::setDefault(pQVar11,(bool)((this->canContinue ^ 1U) & (uVar14 & 8) == 0));
  }
  enableUpdates(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPrivate::_q_updateButtonStates()
{
    Q_Q(QWizard);

    disableUpdates();

    const QWizardPage *page = q->currentPage();
    bool complete = page && page->isComplete();

    btn.back->setEnabled(history.size() > 1
                         && !q->page(history.at(history.size() - 2))->isCommitPage()
                         && (!canFinish || !(opts & QWizard::DisabledBackButtonOnLastPage)));
    btn.next->setEnabled(canContinue && complete);
    btn.commit->setEnabled(canContinue && complete);
    btn.finish->setEnabled(canFinish && complete);

    const bool backButtonVisible = buttonLayoutContains(QWizard::BackButton)
        && (history.size() > 1 || !(opts & QWizard::NoBackButtonOnStartPage))
        && (canContinue || !(opts & QWizard::NoBackButtonOnLastPage));
    bool commitPage = page && page->isCommitPage();
    btn.back->setVisible(backButtonVisible);
    btn.next->setVisible(buttonLayoutContains(QWizard::NextButton) && !commitPage
                         && (canContinue || (opts & QWizard::HaveNextButtonOnLastPage)));
    btn.commit->setVisible(buttonLayoutContains(QWizard::CommitButton) && commitPage
                           && canContinue);
    btn.finish->setVisible(buttonLayoutContains(QWizard::FinishButton)
                           && (canFinish || (opts & QWizard::HaveFinishButtonOnEarlyPages)));

    if (!(opts & QWizard::NoCancelButton))
        btn.cancel->setVisible(buttonLayoutContains(QWizard::CancelButton)
                               && (canContinue || !(opts & QWizard::NoCancelButtonOnLastPage)));

    bool useDefault = !(opts & QWizard::NoDefaultButton);
    if (QPushButton *nextPush = qobject_cast<QPushButton *>(btn.next))
        nextPush->setDefault(canContinue && useDefault && !commitPage);
    if (QPushButton *commitPush = qobject_cast<QPushButton *>(btn.commit))
        commitPush->setDefault(canContinue && useDefault && commitPage);
    if (QPushButton *finishPush = qobject_cast<QPushButton *>(btn.finish))
        finishPush->setDefault(!canContinue && useDefault);

#if QT_CONFIG(style_windowsvista)
    if (isVistaThemeEnabled()) {
        vistaHelper->backButton()->setEnabled(btn.back->isEnabled());
        vistaHelper->backButton()->setVisible(backButtonVisible);
        btn.back->setVisible(false);
    }
#endif

    enableUpdates();
}